

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O2

void Cmd_secret(FCommandLine *argv,APlayerPawn *who,int key)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FString __s1;
  char *pcVar6;
  long lVar7;
  FBrokenLines *lines;
  AActor *this;
  PClass *base;
  level_info_t *plVar8;
  ulong uVar9;
  FString string;
  FString *pFVar10;
  bool bVar11;
  BYTE *local_4b8;
  char *local_4b0;
  FString linebuild;
  FString levelname;
  FString maphdr;
  FWadLump lump;
  char readbuffer [1024];
  
  iVar4 = FCommandLine::argc(argv);
  __s1 = level.MapName;
  if (1 < iVar4) {
    __s1.Chars = FCommandLine::operator[](argv,1);
  }
  iVar4 = strcasecmp(__s1.Chars,level.MapName.Chars);
  iVar5 = FWadCollection::CheckNumForName(&Wads,"SECRETS");
  if (-1 < iVar5) {
    FWadCollection::OpenLumpNum(&lump,&Wads,iVar5);
    maphdr.Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    FString::Format(&maphdr,"[%s]",__s1.Chars);
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    linebuild.Chars = FString::NullString.Nothing;
    local_4b0 = "\x1cV";
    if (iVar4 == 0) {
      local_4b0 = "\x1cK";
    }
    bVar11 = false;
    bVar3 = false;
    while (pcVar6 = FWadLump::Gets(&lump,readbuffer,0x400), pcVar6 != (char *)0x0) {
      if (bVar11) {
        bVar11 = readbuffer[0] != '[';
        if ((bVar11) &&
           ((FString::operator+=(&linebuild,readbuffer), *(uint *)(linebuild.Chars + -0xc) < 0x3ff
            || (linebuild.Chars[0x3fe] == '\n')))) {
          FString::Substitute(&linebuild,"\r",(char *)"");
          FString::StripRight(&linebuild," \t\n");
          local_4b8 = (BYTE *)linebuild.Chars;
          if (linebuild.Chars != (char *)0x0) {
            pcVar6 = local_4b0;
            string = linebuild;
            if (*linebuild.Chars != '$') goto LAB_0036ef0a;
            cVar1 = linebuild.Chars[1];
            if (cVar1 == 'S') {
LAB_0036ee8a:
              lVar7 = strtol(linebuild.Chars + 2,(char **)&local_4b8,10);
              if (*local_4b8 == ';') {
                local_4b8 = local_4b8 + 1;
              }
              pcVar6 = local_4b0;
              string.Chars = (char *)local_4b8;
              if (((iVar4 == 0) && (-1 < lVar7)) && (lVar7 < numsectors)) {
                if ((int)sectors[lVar7].Flags < 0) goto LAB_0036efe7;
                pcVar6 = "\x1cD";
                if (sectors[lVar7].Flags < 0x40000000) {
                  pcVar6 = "\x1cI";
                }
              }
            }
            else if ((cVar1 == 'T') || (cVar1 == 't')) {
              strtol(linebuild.Chars + 2,(char **)&local_4b8,10);
              if (*local_4b8 == ';') {
                local_4b8 = local_4b8 + 1;
              }
              string.Chars = (char *)local_4b8;
              levelname.Chars = (char *)0x0;
              pcVar6 = "\x1cD";
              if (iVar4 == 0) {
                do {
                  this = FActorIterator::Next((FActorIterator *)&levelname);
                  if (this == (AActor *)0x0) {
                    pcVar6 = "\x1cD";
                    goto LAB_0036ef0a;
                  }
                  base = PClass::FindClass("SecretTrigger");
                  bVar2 = DObject::IsKindOf((DObject *)this,base);
                } while (!bVar2);
LAB_0036efe7:
                pcVar6 = "\x1cG";
              }
            }
            else if (cVar1 == 's') goto LAB_0036ee8a;
LAB_0036ef0a:
            lines = V_BreakLines(ConFont,((screen->super_DSimpleCanvas).super_DCanvas.Width * 0x5f)
                                         / 100,(BYTE *)string.Chars,false);
            for (pFVar10 = &lines->Text; -1 < ((FBrokenLines *)(pFVar10 + -1))->Width;
                pFVar10 = pFVar10 + 2) {
              Printf("%s%s\n",pcVar6,pFVar10->Chars);
            }
            V_FreeBrokenLines(lines);
          }
          FString::operator=(&linebuild,(char *)"");
        }
      }
      else {
        bVar11 = false;
        if (readbuffer[0] == '[') {
          iVar5 = strncasecmp(readbuffer,maphdr.Chars,(ulong)*(uint *)(maphdr.Chars + -0xc));
          bVar11 = iVar5 == 0;
          bVar2 = !bVar3;
          bVar3 = true;
          if (bVar2) {
            levelname.Chars = FString::NullString.Nothing;
            FString::NullString.RefCount = FString::NullString.RefCount + 1;
            plVar8 = FindLevelInfo(__s1.Chars,true);
            pcVar6 = (plVar8->LevelName).Chars;
            if ((plVar8->flags & 0x4000000) != 0) {
              pcVar6 = FStringTable::operator[](&GStrings,pcVar6);
            }
            FString::Format(&levelname,"%s - %s\n",__s1.Chars,pcVar6);
            uVar9 = (ulong)*(uint *)(levelname.Chars + -0xc);
            while (uVar9 = uVar9 - 1, uVar9 != 0) {
              FString::operator+=(&levelname,'-');
            }
            Printf("\x1cK%s\n",levelname.Chars);
            FString::~FString(&levelname);
            bVar3 = true;
          }
        }
      }
    }
    FString::~FString(&linebuild);
    FString::~FString(&maphdr);
    FWadLump::~FWadLump(&lump);
  }
  return;
}

Assistant:

CCMD(secret)
{
	const char *mapname = argv.argc() < 2? level.MapName.GetChars() : argv[1];
	bool thislevel = !stricmp(mapname, level.MapName);
	bool foundsome = false;

	int lumpno=Wads.CheckNumForName("SECRETS");
	if (lumpno < 0) return;

	FWadLump lump = Wads.OpenLumpNum(lumpno);
	FString maphdr;
	maphdr.Format("[%s]", mapname);

	FString linebuild;
	char readbuffer[1024];
	bool inlevel = false;

	while (lump.Gets(readbuffer, 1024))
	{
		if (!inlevel)
		{
			if (readbuffer[0] == '[')
			{
				inlevel = !strnicmp(readbuffer, maphdr, maphdr.Len());
				if (!foundsome)
				{
					FString levelname;
					level_info_t *info = FindLevelInfo(mapname);
					const char *ln = !(info->flags & LEVEL_LOOKUPLEVELNAME)? info->LevelName.GetChars() : GStrings[info->LevelName.GetChars()];
					levelname.Format("%s - %s\n", mapname, ln);
					size_t llen = levelname.Len() - 1;
					for(size_t ii=0; ii<llen; ii++) levelname += '-';
					Printf(TEXTCOLOR_YELLOW"%s\n", levelname.GetChars());
					foundsome = true;
				}
			}
			continue;
		}
		else
		{
			if (readbuffer[0] != '[')
			{
				linebuild += readbuffer;
				if (linebuild.Len() < 1023 || linebuild[1022] == '\n')
				{
					// line complete so print it.
					linebuild.Substitute("\r", "");
					linebuild.StripRight(" \t\n");
					PrintSecretString(linebuild, thislevel);
					linebuild = "";
				}
			}
			else inlevel = false;
		}
	}
}